

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

void __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::BaseRenderingTestInstance
          (BaseRenderingTestInstance *this,Context *context,VkSampleCountFlagBits sampleCount,
          deUint32 renderSize)

{
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar2;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar3;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)13>_> *__s;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar5;
  Move<vk::Handle<(vk::HandleType)23>_> *pMVar6;
  Move<vk::Handle<(vk::HandleType)21>_> *pMVar7;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar8;
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar9;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar10;
  Move<vk::Handle<(vk::HandleType)16>_> *__s_00;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar11;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar12;
  Move<vk::Handle<(vk::HandleType)6>_> *pMVar13;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar14;
  deUint32 *pdVar15;
  void **ppvVar16;
  VkCommandPool obj;
  VkImage VVar17;
  deUint64 dVar18;
  VkRenderPass obj_00;
  VkFramebuffer obj_01;
  VkBuffer VVar19;
  VkDescriptorPool obj_02;
  VkDescriptorSetLayout obj_03;
  DeviceInterface *pDVar20;
  VkPipelineLayout obj_04;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var21;
  VkShaderModule VVar22;
  VkFence obj_05;
  undefined8 uVar23;
  undefined8 uVar24;
  VkAttachmentReference *pVVar25;
  undefined8 uVar26;
  VkDeviceSize VVar27;
  VkImageView VVar28;
  Handle<(vk::HandleType)17> HVar29;
  VkDevice pVVar30;
  VkAllocationCallbacks *pVVar31;
  int iVar32;
  VkResult VVar33;
  VkPhysicalDeviceProperties *pVVar34;
  TextureFormat TVar35;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar36;
  InstanceInterface *pIVar37;
  VkPhysicalDevice pVVar38;
  const_iterator cVar39;
  NotSupportedError *pNVar40;
  VkImageView VVar41;
  Allocation *pAVar42;
  bool bVar43;
  VkSubpassDescription subpassDesc;
  deUint32 queueFamilyIndex;
  VkImageFormatProperties properties;
  VkImageView attachments [2];
  VkAttachmentReference *local_2d8;
  VkAllocationCallbacks *pVStack_2d0;
  DescriptorPoolBuilder descriptorPoolBuilder;
  Move<vk::Handle<(vk::HandleType)17>_> local_238;
  Move<vk::Handle<(vk::HandleType)9>_> *local_218;
  Move<vk::Handle<(vk::HandleType)24>_> *local_210;
  VkFramebufferCreateInfo framebufferCreateInfo;
  ios_base local_190 [264];
  DescriptorSetLayoutBuilder descriptorSetLayoutBuilder;
  VkAttachmentReference resolveAttachmentRef;
  VkAttachmentReference attachmentRef;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_00d36630;
  this->m_renderSize = renderSize;
  this->m_sampleCount = sampleCount;
  pVVar34 = Context::getDeviceProperties(context);
  this->m_subpixelBits = (pVVar34->limits).subPixelPrecisionBits;
  this->m_multisampling = (uint)(this->m_sampleCount != VK_SAMPLE_COUNT_1_BIT);
  this->m_imageFormat = VK_FORMAT_R8G8B8A8_UNORM;
  TVar35 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  this->m_textureFormat = TVar35;
  pMVar1 = &this->m_commandPool;
  pMVar2 = &this->m_image;
  pMVar3 = &this->m_imageView;
  pMVar4 = &this->m_resolvedImage;
  __s = &this->m_resolvedImageView;
  pMVar5 = &this->m_renderPass;
  pMVar6 = &this->m_frameBuffer;
  pMVar7 = &this->m_descriptorPool;
  pMVar8 = &this->m_descriptorSet;
  pMVar9 = &this->m_descriptorSetLayout;
  pMVar10 = &this->m_uniformBuffer;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
  .ptr = (Allocation *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImageMemory).
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  memset(__s,0,0xe8);
  this->m_uniformBufferSize = 4;
  __s_00 = &this->m_pipelineLayout;
  pMVar11 = &this->m_vertexShaderModule;
  pMVar12 = &this->m_fragmentShaderModule;
  pMVar13 = &this->m_fence;
  pMVar14 = &this->m_resultBuffer;
  memset(__s_00,0,0xa8);
  local_218 = pMVar2;
  local_210 = pMVar1;
  iVar32 = tcu::TextureFormat::getPixelSize(&this->m_textureFormat);
  this->m_resultBufferSize = (ulong)(renderSize * renderSize * iVar32);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pAVar36 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&descriptorPoolBuilder);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&descriptorSetLayoutBuilder);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  uVar26 = subpassDesc._24_8_;
  pVVar25 = subpassDesc.pInputAttachments;
  uVar24 = subpassDesc._8_8_;
  uVar23 = subpassDesc._0_8_;
  framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
  framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
  framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
  framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
  framebufferCreateInfo.sType = subpassDesc.flags;
  framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
  framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
  framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
  subpassDesc.flags = 0;
  subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDesc.inputAttachmentCount = 0;
  subpassDesc._12_4_ = 0;
  subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDesc.colorAttachmentCount = 0;
  subpassDesc._28_4_ = 0;
  obj.m_internal = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal
  ;
  if (obj.m_internal == 0) {
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)pVVar25;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)uVar26;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal = uVar23;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar24;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               obj);
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)
           CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                    (VkFormat)framebufferCreateInfo.renderPass.m_internal);
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
         framebufferCreateInfo._0_8_;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
    m_deviceIface =
         (DeviceInterface *)
         CONCAT44(framebufferCreateInfo.pNext._4_4_,
                  (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
    if (subpassDesc._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc.inputAttachmentCount,
                 (VkCommandPool)subpassDesc._0_8_);
    }
  }
  pIVar37 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar38 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  iVar32 = (*pIVar37->_vptr_InstanceInterface[4])
                     (pIVar37,pVVar38,(ulong)this->m_imageFormat,1,0,0x11,0,&properties);
  if (iVar32 == -0xb) {
    pNVar40 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar40,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xeb);
  }
  else {
    framebufferCreateInfo.width = this->m_sampleCount;
    if ((framebufferCreateInfo.width & ~properties.sampleCounts) == 0) {
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo._20_4_ = 1;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = this->m_imageFormat;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = this->m_renderSize;
      framebufferCreateInfo._36_4_ = 1;
      framebufferCreateInfo.pAttachments._0_4_ = 1;
      framebufferCreateInfo.pAttachments._4_4_ = 1;
      framebufferCreateInfo.height = 0;
      framebufferCreateInfo.layers = 0x11;
      framebufferCreateInfo._60_4_ = 0;
      framebufferCreateInfo.attachmentCount = framebufferCreateInfo.renderPass.m_internal._4_4_;
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                        (VkImageCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      VVar28 = attachments[1];
      VVar41 = attachments[0];
      subpassDesc.pInputAttachments = local_2d8;
      subpassDesc._24_8_ = pVStack_2d0;
      subpassDesc.flags = (undefined4)attachments[0].m_internal;
      subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
      subpassDesc._8_8_ = attachments[1].m_internal;
      attachments[0].m_internal = 0;
      attachments[1].m_internal = 0;
      VVar17.m_internal =
           (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
      if (VVar17.m_internal == 0) {
        (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
             (VkDevice)local_2d8;
        (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
             pVStack_2d0;
        (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
             VVar41.m_internal;
        (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)VVar28.m_internal;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                   VVar17);
        (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
             (VkDevice)subpassDesc.pInputAttachments;
        (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)subpassDesc._24_8_;
        (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)subpassDesc._8_8_;
        if (attachments[0].m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(attachments + 1),
                     (VkImage)attachments[0].m_internal);
        }
      }
      ::vk::getImageMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkImage)(pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                          m_internal);
      (*pAVar36->_vptr_Allocator[3])(attachments,pAVar36,&subpassDesc,0);
      VVar28 = attachments[0];
      attachments[0].m_internal = 0;
      VVar41.m_internal =
           (deUint64)
           (this->m_imageMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (VVar41.m_internal != VVar28.m_internal) {
        if ((Allocation *)VVar41.m_internal == (Allocation *)0x0) {
          (this->m_imageMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)VVar28.m_internal;
          VVar41 = VVar28;
        }
        else {
          (*((Allocation *)VVar41.m_internal)->_vptr_Allocation[1])();
          (this->m_imageMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)VVar28.m_internal;
          VVar41 = VVar28;
          if (attachments[0].m_internal != 0) {
            (**(code **)(*(long *)attachments[0].m_internal + 8))();
            VVar41.m_internal =
                 (deUint64)
                 (this->m_imageMemory).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
          }
        }
      }
      VVar33 = (*vk->_vptr_DeviceInterface[0xd])
                         (vk,device,
                          (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                          m_internal,(((Allocation *)VVar41.m_internal)->m_memory).m_internal);
      ::vk::checkResult(VVar33,
                        "vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                        ,0x109);
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      dVar18 = (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
               m_internal;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)dVar18;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = (deUint32)(dVar18 >> 0x20);
      framebufferCreateInfo.attachmentCount = 1;
      framebufferCreateInfo._36_4_ = this->m_imageFormat;
      framebufferCreateInfo.pAttachments._0_4_ = 3;
      framebufferCreateInfo.pAttachments._4_4_ = 4;
      framebufferCreateInfo.width = 5;
      framebufferCreateInfo.height = 6;
      framebufferCreateInfo.layers = 1;
      framebufferCreateInfo._60_4_ = 0;
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                 (VkImageViewCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      VVar27 = properties.maxResourceSize;
      uVar26 = properties._16_8_;
      uVar24 = properties._8_8_;
      uVar23 = properties.maxExtent._0_8_;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar41.m_internal =
           (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
      if (VVar41.m_internal == 0) {
        (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)uVar26;
        (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)VVar27;
        (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar23;
        (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                    deleter,VVar41);
        (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)subpassDesc.pInputAttachments;
        (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        if (properties.maxExtent._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&properties.maxExtent.depth,
                     (VkImageView)properties.maxExtent._0_8_);
        }
      }
      if (this->m_multisampling == 0) {
        bVar43 = true;
      }
      else {
        pIVar37 = Context::getInstanceInterface((this->super_TestInstance).m_context);
        pVVar38 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
        iVar32 = (*pIVar37->_vptr_InstanceInterface[4])
                           (pIVar37,pVVar38,(ulong)this->m_imageFormat,1,0,0x13,0,&properties);
        if (iVar32 == -0xb) {
          pNVar40 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar40,"Format not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                     ,0x132);
          __cxa_throw(pNVar40,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
        framebufferCreateInfo.pNext._0_4_ = 0;
        framebufferCreateInfo.pNext._4_4_ = 0;
        framebufferCreateInfo.flags = 0;
        framebufferCreateInfo._20_4_ = 1;
        framebufferCreateInfo.renderPass.m_internal._0_4_ = this->m_imageFormat;
        framebufferCreateInfo.renderPass.m_internal._4_4_ = this->m_renderSize;
        framebufferCreateInfo._36_4_ = 1;
        framebufferCreateInfo.pAttachments._0_4_ = 1;
        framebufferCreateInfo.pAttachments._4_4_ = 1;
        framebufferCreateInfo.width = 1;
        framebufferCreateInfo.height = 0;
        framebufferCreateInfo.layers = 0x13;
        framebufferCreateInfo._60_4_ = 0;
        framebufferCreateInfo.attachmentCount = framebufferCreateInfo.renderPass.m_internal._4_4_;
        ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                          (VkImageCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
        VVar28 = attachments[1];
        VVar41 = attachments[0];
        subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
        subpassDesc.colorAttachmentCount = 0;
        subpassDesc._28_4_ = 0;
        subpassDesc.flags = (undefined4)attachments[0].m_internal;
        subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
        subpassDesc._8_8_ = attachments[1].m_internal;
        attachments[0].m_internal = 0;
        attachments[1].m_internal = 0;
        VVar17.m_internal =
             (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
        if (VVar17.m_internal == 0) {
          (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
          m_device = (VkDevice)0x0;
          (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
          m_allocator = (VkAllocationCallbacks *)0x0;
          (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
               VVar41.m_internal;
          (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
          m_deviceIface = (DeviceInterface *)VVar28.m_internal;
        }
        else {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      deleter,VVar17);
          (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
          m_device = (VkDevice)subpassDesc.pInputAttachments;
          (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
          m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
          (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
               subpassDesc._0_8_;
          (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
          m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
          if (attachments[0].m_internal != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(attachments + 1),
                       (VkImage)attachments[0].m_internal);
          }
        }
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)&subpassDesc,vk,device,
                   (VkImage)(pMVar4->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                            m_internal);
        (*pAVar36->_vptr_Allocator[3])(attachments,pAVar36,&subpassDesc,0);
        VVar28 = attachments[0];
        attachments[0].m_internal = 0;
        VVar41.m_internal =
             (deUint64)
             (this->m_resolvedImageMemory).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        if (VVar41.m_internal != VVar28.m_internal) {
          if ((Allocation *)VVar41.m_internal == (Allocation *)0x0) {
            (this->m_resolvedImageMemory).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
                 (Allocation *)VVar28.m_internal;
            VVar41 = VVar28;
          }
          else {
            (*((Allocation *)VVar41.m_internal)->_vptr_Allocation[1])();
            (this->m_resolvedImageMemory).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
                 (Allocation *)VVar28.m_internal;
            VVar41 = VVar28;
            if (attachments[0].m_internal != 0) {
              (**(code **)(*(long *)attachments[0].m_internal + 8))();
              VVar41.m_internal =
                   (deUint64)
                   (this->m_resolvedImageMemory).
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
            }
          }
        }
        VVar33 = (*vk->_vptr_DeviceInterface[0xd])
                           (vk,device,
                            (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                            m_internal,(((Allocation *)VVar41.m_internal)->m_memory).m_internal);
        ::vk::checkResult(VVar33,
                          "vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                          ,0x14a);
        framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
        framebufferCreateInfo.pNext._0_4_ = 0;
        framebufferCreateInfo.pNext._4_4_ = 0;
        framebufferCreateInfo.flags = 0;
        dVar18 = (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object
                 .m_internal;
        framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)dVar18;
        framebufferCreateInfo.renderPass.m_internal._4_4_ = (deUint32)(dVar18 >> 0x20);
        framebufferCreateInfo.attachmentCount = 1;
        framebufferCreateInfo._36_4_ = this->m_imageFormat;
        framebufferCreateInfo.pAttachments._0_4_ = 3;
        framebufferCreateInfo.pAttachments._4_4_ = 4;
        framebufferCreateInfo.width = 5;
        framebufferCreateInfo.height = 6;
        framebufferCreateInfo.layers = 1;
        framebufferCreateInfo._60_4_ = 0;
        ::vk::createImageView
                  ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                   (VkImageViewCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
        VVar27 = properties.maxResourceSize;
        uVar26 = properties._16_8_;
        uVar24 = properties._8_8_;
        uVar23 = properties.maxExtent._0_8_;
        subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
        subpassDesc._24_8_ = properties.maxResourceSize;
        subpassDesc.flags = properties.maxExtent.width;
        subpassDesc.pipelineBindPoint = properties.maxExtent.height;
        subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
        subpassDesc._12_4_ = properties.maxMipLevels;
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
        properties.maxExtent.depth = 0;
        properties.maxMipLevels = 0;
        properties.maxArrayLayers = 0;
        properties.sampleCounts = 0;
        properties.maxResourceSize = 0;
        VVar41.m_internal =
             (__s->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
        if (VVar41.m_internal == 0) {
          (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
          m_device = (VkDevice)uVar26;
          (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
          m_allocator = (VkAllocationCallbacks *)VVar27;
          (__s->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar23;
          (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
          m_deviceIface = (DeviceInterface *)uVar24;
        }
        else {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&(this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.
                      m_data.deleter,VVar41);
          (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
          m_device = (VkDevice)subpassDesc.pInputAttachments;
          (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
          m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
          (__s->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
               subpassDesc._0_8_;
          (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
          m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
          if (properties.maxExtent._0_8_ != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&properties.maxExtent.depth,
                       (VkImageView)properties.maxExtent._0_8_);
          }
        }
        bVar43 = this->m_multisampling == 0;
      }
      framebufferCreateInfo.pAttachments._0_4_ = this->m_imageFormat;
      framebufferCreateInfo._0_8_ = (ulong)(VkFormat)framebufferCreateInfo.pAttachments << 0x20;
      framebufferCreateInfo.pNext._0_4_ = this->m_sampleCount;
      framebufferCreateInfo.pNext._4_4_ = 1;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo._20_4_ = 2;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = 1;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = 2;
      framebufferCreateInfo.attachmentCount = 2;
      framebufferCreateInfo._36_4_ = 0;
      framebufferCreateInfo.pAttachments._4_4_ = 1;
      framebufferCreateInfo.width = 2;
      framebufferCreateInfo.height = 0;
      framebufferCreateInfo.layers = 2;
      framebufferCreateInfo._60_4_ = 1;
      subpassDesc.pColorAttachments = &attachmentRef;
      attachmentRef.attachment = 0;
      attachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      resolveAttachmentRef.attachment = 1;
      resolveAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc._8_8_ = subpassDesc._8_8_ & 0xffffffff00000000;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 1;
      subpassDesc.pResolveAttachments = &resolveAttachmentRef;
      if (bVar43 != false) {
        subpassDesc.pResolveAttachments = (VkAttachmentReference *)0x0;
      }
      subpassDesc.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
      subpassDesc.preserveAttachmentCount = 0;
      subpassDesc.pPreserveAttachments = (deUint32 *)0x0;
      properties.maxExtent.width = 0x26;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties._16_8_ = (ulong)(2 - bVar43) << 0x20;
      properties.maxResourceSize = (VkDeviceSize)&framebufferCreateInfo;
      ::vk::createRenderPass
                (&local_238,vk,device,(VkRenderPassCreateInfo *)&properties,
                 (VkAllocationCallbacks *)0x0);
      pVVar31 = local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
      pVVar30 = local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
      pDVar20 = local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                m_deviceIface;
      HVar29.m_internal =
           local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
      attachments[0].m_internal =
           local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
      attachments[1].m_internal =
           (deUint64)
           local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
      local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
      local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      obj_00.m_internal =
           (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal;
      if (obj_00.m_internal == 0) {
        (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device
             = pVVar30;
        (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
        m_allocator = pVVar31;
        (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
             HVar29.m_internal;
        (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
        m_deviceIface = pDVar20;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                  (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                    deleter,obj_00);
        (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device
             = pVVar30;
        (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
        m_allocator = pVVar31;
        (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
             attachments[0].m_internal;
        (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)attachments[1].m_internal;
        if (local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                    (&local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                     (VkRenderPass)
                     local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                     m_internal);
        }
      }
      attachments[0].m_internal =
           (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      attachments[1].m_internal =
           (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      dVar18 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
               m_internal;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)dVar18;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = (deUint32)(dVar18 >> 0x20);
      framebufferCreateInfo.attachmentCount = 2 - (this->m_multisampling == 0);
      framebufferCreateInfo.pAttachments = attachments;
      framebufferCreateInfo.width = this->m_renderSize;
      framebufferCreateInfo.layers = 1;
      framebufferCreateInfo.height = framebufferCreateInfo.width;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)&properties,vk,device,
                 &framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      VVar27 = properties.maxResourceSize;
      uVar26 = properties._16_8_;
      uVar24 = properties._8_8_;
      uVar23 = properties.maxExtent._0_8_;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      obj_01.m_internal =
           (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal;
      if (obj_01.m_internal == 0) {
        (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device
             = (VkDevice)uVar26;
        (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)VVar27;
        (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal = uVar23;
        (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  (&(this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.
                    deleter,obj_01);
        (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device
             = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        if (properties.maxExtent._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&properties.maxExtent.depth,
                     (VkFramebuffer)properties.maxExtent._0_8_);
        }
      }
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)this->m_uniformBufferSize;
      framebufferCreateInfo.renderPass.m_internal._4_4_ =
           (deUint32)(this->m_uniformBufferSize >> 0x20);
      framebufferCreateInfo.attachmentCount = 0x10;
      framebufferCreateInfo._36_4_ = 0;
      framebufferCreateInfo.pAttachments._0_4_ = 1;
      framebufferCreateInfo._48_8_ = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         (VkBufferCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      VVar27 = properties.maxResourceSize;
      uVar26 = properties._16_8_;
      uVar24 = properties._8_8_;
      uVar23 = properties.maxExtent._0_8_;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar19.m_internal =
           (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      if (VVar19.m_internal == 0) {
        (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_device = (VkDevice)uVar26;
        (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)VVar27;
        (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal = uVar23;
        (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                    deleter,VVar19);
        (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        if (properties.maxExtent._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&properties.maxExtent.depth,
                     (VkBuffer)properties.maxExtent._0_8_);
        }
      }
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar36->_vptr_Allocator[3])(&properties,pAVar36,&subpassDesc,1);
      uVar23 = properties.maxExtent._0_8_;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      pAVar42 = (this->m_uniformBufferMemory).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (pAVar42 != (Allocation *)uVar23) {
        if (pAVar42 == (Allocation *)0x0) {
          (this->m_uniformBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)uVar23;
          pAVar42 = (Allocation *)uVar23;
        }
        else {
          (*pAVar42->_vptr_Allocation[1])();
          (this->m_uniformBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)uVar23;
          pAVar42 = (Allocation *)uVar23;
          if (properties.maxExtent._0_8_ != 0) {
            (**(code **)(*(long *)properties.maxExtent._0_8_ + 8))();
            pAVar42 = (this->m_uniformBufferMemory).
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr;
          }
        }
      }
      VVar33 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                          m_internal,(pAVar42->m_memory).m_internal,pAVar42->m_offset);
      ::vk::checkResult(VVar33,
                        "vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                        ,0x1d6);
      ::vk::DescriptorPoolBuilder::addType
                (&descriptorPoolBuilder,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc,&descriptorPoolBuilder,vk,
                 device,1,1);
      uVar26 = subpassDesc._24_8_;
      pVVar25 = subpassDesc.pInputAttachments;
      uVar24 = subpassDesc._8_8_;
      uVar23 = subpassDesc._0_8_;
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      obj_02.m_internal =
           (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal;
      if (obj_02.m_internal == 0) {
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_device = (VkDevice)pVVar25;
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)uVar26;
        (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal = uVar23;
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    deleter,obj_02);
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_device = (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)
                      CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                               (VkFormat)framebufferCreateInfo.renderPass.m_internal);
        (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
             framebufferCreateInfo._0_8_;
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_deviceIface =
             (DeviceInterface *)
             CONCAT44(framebufferCreateInfo.pNext._4_4_,
                      (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
        if (subpassDesc._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc.inputAttachmentCount,
                     (VkDescriptorPool)subpassDesc._0_8_);
        }
      }
      ::vk::DescriptorSetLayoutBuilder::addBinding
                (&descriptorSetLayoutBuilder,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,0x7fffffff,
                 (VkSampler *)0x0);
      ::vk::DescriptorSetLayoutBuilder::build
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&subpassDesc,&descriptorSetLayoutBuilder,
                 vk,device,0);
      uVar26 = subpassDesc._24_8_;
      pVVar25 = subpassDesc.pInputAttachments;
      uVar24 = subpassDesc._8_8_;
      uVar23 = subpassDesc._0_8_;
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      obj_03.m_internal =
           (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
      if (obj_03.m_internal == 0) {
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_device = (VkDevice)pVVar25;
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)uVar26;
        (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal = uVar23;
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                    m_data.deleter,obj_03);
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_device = (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)
                      CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                               (VkFormat)framebufferCreateInfo.renderPass.m_internal);
        (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
             framebufferCreateInfo._0_8_;
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_deviceIface =
             (DeviceInterface *)
             CONCAT44(framebufferCreateInfo.pNext._4_4_,
                      (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
        if (subpassDesc._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)19>_> *)&subpassDesc.inputAttachmentCount,
                     (VkDescriptorSetLayout)subpassDesc._0_8_);
        }
      }
      subpassDesc.flags = 0x22;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments =
           (VkAttachmentReference *)
           (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal;
      subpassDesc.colorAttachmentCount = 1;
      subpassDesc.pColorAttachments = (VkAttachmentReference *)pMVar9;
      ::vk::allocateDescriptorSet
                ((Move<vk::Handle<(vk::HandleType)22>_> *)&properties,vk,device,
                 (VkDescriptorSetAllocateInfo *)&subpassDesc);
      VVar27 = properties.maxResourceSize;
      uVar26 = properties._16_8_;
      uVar24 = properties._8_8_;
      uVar23 = properties.maxExtent._0_8_;
      framebufferCreateInfo.flags = properties.maxArrayLayers;
      framebufferCreateInfo._20_4_ = properties.sampleCounts;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (undefined4)properties.maxResourceSize;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = properties.maxResourceSize._4_4_;
      framebufferCreateInfo.sType = properties.maxExtent.width;
      framebufferCreateInfo._4_4_ = properties.maxExtent.height;
      framebufferCreateInfo.pNext._0_4_ = properties.maxExtent.depth;
      framebufferCreateInfo.pNext._4_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      dVar18 = (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal;
      if (dVar18 == 0) {
        (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_device = (VkDevice)uVar26;
        (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
        .m_internal = VVar27;
        (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal = uVar23;
        (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        pDVar20 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                  deleter.m_deviceIface;
        attachments[0].m_internal = dVar18;
        (*pDVar20->_vptr_DeviceInterface[0x3d])
                  (pDVar20,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                           m_data.deleter.m_device,
                   (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                   deleter.m_pool.m_internal,1);
        *(VkFramebufferCreateFlags *)
         &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
          m_device = framebufferCreateInfo.flags;
        *(undefined4 *)
         ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 deleter.m_device + 4) = framebufferCreateInfo._20_4_;
        *(VkFormat *)
         &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
          m_pool.m_internal = (VkFormat)framebufferCreateInfo.renderPass.m_internal;
        *(deUint32 *)
         ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 deleter.m_pool.m_internal + 4) = framebufferCreateInfo.renderPass.m_internal._4_4_;
        *(VkStructureType *)
         &(pMVar8->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
             framebufferCreateInfo.sType;
        *(undefined4 *)
         ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 object.m_internal + 4) = framebufferCreateInfo._4_4_;
        *(VkSampleCountFlagBits *)
         &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
          m_deviceIface = (VkSampleCountFlagBits)framebufferCreateInfo.pNext;
        *(deUint32 *)
         ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 deleter.m_deviceIface + 4) = framebufferCreateInfo.pNext._4_4_;
        if (properties.maxExtent._0_8_ != 0) {
          framebufferCreateInfo.sType = properties.maxExtent.width;
          framebufferCreateInfo._4_4_ = properties.maxExtent.height;
          (**(code **)(*(long *)properties._8_8_ + 0x1e8))
                    (properties._8_8_,properties._16_8_,properties.maxResourceSize,1);
        }
      }
      properties.maxExtent._0_8_ =
           (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0xffffffff;
      properties.sampleCounts = 0xffffffff;
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      dVar18 = (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal;
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)dVar18;
      framebufferCreateInfo._20_4_ = SUB84(dVar18 >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = 0;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = 0;
      framebufferCreateInfo.attachmentCount = 1;
      framebufferCreateInfo._36_4_ = 6;
      framebufferCreateInfo.pAttachments._0_4_ = 0;
      framebufferCreateInfo.pAttachments._4_4_ = 0;
      framebufferCreateInfo.layers = 0;
      framebufferCreateInfo._60_4_ = 0;
      framebufferCreateInfo._48_8_ = &properties;
      (*vk->_vptr_DeviceInterface[0x3e])(vk,device,1,&framebufferCreateInfo,0,0);
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo._20_4_ = 1;
      framebufferCreateInfo.attachmentCount = 0;
      framebufferCreateInfo.pAttachments._0_4_ = 0;
      framebufferCreateInfo.pAttachments._4_4_ = 0;
      framebufferCreateInfo.renderPass.m_internal = (deUint64)pMVar9;
      ::vk::createPipelineLayout
                ((Move<vk::Handle<(vk::HandleType)16>_> *)&properties,vk,device,
                 (VkPipelineLayoutCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      VVar27 = properties.maxResourceSize;
      uVar26 = properties._16_8_;
      uVar24 = properties._8_8_;
      uVar23 = properties.maxExtent._0_8_;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      obj_04.m_internal =
           (__s_00->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal;
      if (obj_04.m_internal == 0) {
        (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
        m_device = (VkDevice)uVar26;
        (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)VVar27;
        (__s_00->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal = uVar23;
        (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                  (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                    deleter,obj_04);
        (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (__s_00->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        if (properties.maxExtent._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&properties.maxExtent.depth,
                     (VkPipelineLayout)properties.maxExtent._0_8_);
        }
      }
      p_Var21 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 *)((this->super_TestInstance).m_context)->m_progCollection;
      pdVar15 = &properties.maxArrayLayers;
      properties.maxExtent._0_8_ = pdVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"vertext_shader","");
      cVar39 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find(p_Var21,(key_type *)&properties);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc,vk,device,
                 *(ProgramBinary **)(cVar39._M_node + 2),0);
      uVar26 = subpassDesc._24_8_;
      pVVar25 = subpassDesc.pInputAttachments;
      uVar24 = subpassDesc._8_8_;
      uVar23 = subpassDesc._0_8_;
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      VVar22.m_internal =
           (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
      if (VVar22.m_internal == 0) {
        (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
        m_device = (VkDevice)pVVar25;
        (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)uVar26;
        (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = uVar23;
        (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&(this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter,VVar22);
        (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
        m_device = (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
        (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)
                      CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                               (VkFormat)framebufferCreateInfo.renderPass.m_internal);
        (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
             framebufferCreateInfo._0_8_;
        (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
        m_deviceIface =
             (DeviceInterface *)
             CONCAT44(framebufferCreateInfo.pNext._4_4_,
                      (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
        if (subpassDesc._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc.inputAttachmentCount,
                     (VkShaderModule)subpassDesc._0_8_);
        }
      }
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      if ((deUint32 *)properties.maxExtent._0_8_ != pdVar15) {
        operator_delete((void *)properties.maxExtent._0_8_,properties._16_8_ + 1);
      }
      p_Var21 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 *)((this->super_TestInstance).m_context)->m_progCollection;
      properties.maxExtent._0_8_ = pdVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"fragment_shader","");
      cVar39 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find(p_Var21,(key_type *)&properties);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc,vk,device,
                 *(ProgramBinary **)(cVar39._M_node + 2),0);
      uVar26 = subpassDesc._24_8_;
      pVVar25 = subpassDesc.pInputAttachments;
      uVar24 = subpassDesc._8_8_;
      uVar23 = subpassDesc._0_8_;
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      VVar22.m_internal =
           (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
      if (VVar22.m_internal == 0) {
        (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
        .m_device = (VkDevice)pVVar25;
        (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
        .m_allocator = (VkAllocationCallbacks *)uVar26;
        (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = uVar23;
        (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
        .m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&(this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter,VVar22);
        (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
        .m_device = (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
        (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
        .m_allocator = (VkAllocationCallbacks *)
                       CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                                (VkFormat)framebufferCreateInfo.renderPass.m_internal);
        (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
             framebufferCreateInfo._0_8_;
        (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
        .m_deviceIface =
             (DeviceInterface *)
             CONCAT44(framebufferCreateInfo.pNext._4_4_,
                      (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
        if (subpassDesc._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc.inputAttachmentCount,
                     (VkShaderModule)subpassDesc._0_8_);
        }
      }
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      if ((deUint32 *)properties.maxExtent._0_8_ != pdVar15) {
        operator_delete((void *)properties.maxExtent._0_8_,properties._16_8_ + 1);
      }
      ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc,vk,device,0,
                        (VkAllocationCallbacks *)0x0);
      uVar26 = subpassDesc._24_8_;
      pVVar25 = subpassDesc.pInputAttachments;
      uVar24 = subpassDesc._8_8_;
      uVar23 = subpassDesc._0_8_;
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      obj_05.m_internal =
           (pMVar13->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal;
      if (obj_05.m_internal == 0) {
        (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
             (VkDevice)pVVar25;
        (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)uVar26;
        (pMVar13->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal = uVar23;
        (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                   obj_05);
        (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
             (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
        (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)
             CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                      (VkFormat)framebufferCreateInfo.renderPass.m_internal);
        (pMVar13->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal =
             framebufferCreateInfo._0_8_;
        (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)
             CONCAT44(framebufferCreateInfo.pNext._4_4_,
                      (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
        if (subpassDesc._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc.inputAttachmentCount,
                     (VkFence)subpassDesc._0_8_);
        }
      }
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)this->m_resultBufferSize;
      framebufferCreateInfo.renderPass.m_internal._4_4_ =
           (deUint32)(this->m_resultBufferSize >> 0x20);
      framebufferCreateInfo.attachmentCount = 2;
      framebufferCreateInfo._36_4_ = 0;
      framebufferCreateInfo.pAttachments._0_4_ = 1;
      framebufferCreateInfo._48_8_ = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         (VkBufferCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      VVar27 = properties.maxResourceSize;
      uVar26 = properties._16_8_;
      uVar24 = properties._8_8_;
      uVar23 = properties.maxExtent._0_8_;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar19.m_internal =
           (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      if (VVar19.m_internal == 0) {
        (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
             = (VkDevice)uVar26;
        (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)VVar27;
        (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal = uVar23;
        (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)uVar24;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                    deleter,VVar19);
        (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
             = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        if (properties.maxExtent._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&properties.maxExtent.depth,
                     (VkBuffer)properties.maxExtent._0_8_);
        }
      }
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar36->_vptr_Allocator[3])(&properties,pAVar36,&subpassDesc,1);
      uVar23 = properties.maxExtent._0_8_;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      pAVar42 = (this->m_resultBufferMemory).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (pAVar42 != (Allocation *)uVar23) {
        if (pAVar42 == (Allocation *)0x0) {
          (this->m_resultBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)uVar23;
          pAVar42 = (Allocation *)uVar23;
        }
        else {
          (*pAVar42->_vptr_Allocation[1])();
          (this->m_resultBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)uVar23;
          pAVar42 = (Allocation *)uVar23;
          if (properties.maxExtent._0_8_ != 0) {
            (**(code **)(*(long *)properties.maxExtent._0_8_ + 8))();
            pAVar42 = (this->m_resultBufferMemory).
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr;
          }
        }
      }
      VVar33 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                          m_internal,(pAVar42->m_memory).m_internal,pAVar42->m_offset);
      ::vk::checkResult(VVar33,
                        "vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                        ,0x22e);
      framebufferCreateInfo._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      ppvVar16 = &framebufferCreateInfo.pNext;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar16,"Sample count = ",0xf);
      ::vk::getSampleCountFlagsStr((Bitfield<32UL> *)&properties,this->m_sampleCount);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      tcu::Format::Bitfield<32UL>::toStream((Bitfield<32UL> *)&subpassDesc,(ostream *)ppvVar16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&framebufferCreateInfo,
                 (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar16);
      std::ios_base::~ios_base(local_190);
      framebufferCreateInfo._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      ppvVar16 = &framebufferCreateInfo.pNext;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar16,"SUBPIXEL_BITS = ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)ppvVar16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&framebufferCreateInfo,
                 (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar16);
      std::ios_base::~ios_base(local_190);
      if (descriptorSetLayoutBuilder.m_immutableSamplers.
          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(descriptorSetLayoutBuilder.m_immutableSamplers.
                        super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)descriptorSetLayoutBuilder.m_immutableSamplers.
                              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)descriptorSetLayoutBuilder.m_immutableSamplers.
                              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (descriptorSetLayoutBuilder.m_immutableSamplerInfos.
          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(descriptorSetLayoutBuilder.m_immutableSamplerInfos.
                        super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)descriptorSetLayoutBuilder.m_immutableSamplerInfos.
                              super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)descriptorSetLayoutBuilder.m_immutableSamplerInfos.
                              super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (descriptorSetLayoutBuilder.m_bindings.
          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(descriptorSetLayoutBuilder.m_bindings.
                        super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)descriptorSetLayoutBuilder.m_bindings.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)descriptorSetLayoutBuilder.m_bindings.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (descriptorPoolBuilder.m_counts.
          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(descriptorPoolBuilder.m_counts.
                        super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)descriptorPoolBuilder.m_counts.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)descriptorPoolBuilder.m_counts.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    pNVar40 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar40,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xf0);
  }
  __cxa_throw(pNVar40,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

BaseRenderingTestInstance::BaseRenderingTestInstance (Context& context, VkSampleCountFlagBits sampleCount, deUint32 renderSize)
	: TestInstance			(context)
	, m_renderSize			(renderSize)
	, m_sampleCount			(sampleCount)
	, m_subpixelBits		(context.getDeviceProperties().limits.subPixelPrecisionBits)
	, m_multisampling		(m_sampleCount != VK_SAMPLE_COUNT_1_BIT)
	, m_imageFormat			(VK_FORMAT_R8G8B8A8_UNORM)
	, m_textureFormat		(vk::mapVkFormat(m_imageFormat))
	, m_uniformBufferSize	(sizeof(float))
	, m_resultBufferSize	(renderSize * renderSize * m_textureFormat.getPixelSize())
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();
	DescriptorPoolBuilder						descriptorPoolBuilder;
	DescriptorSetLayoutBuilder					descriptorSetLayoutBuilder;

	// Command Pool
	m_commandPool = createCommandPool(vkd, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Image
	{
		const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;
		VkImageFormatProperties	properties;

		if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																					 m_imageFormat,
																					 VK_IMAGE_TYPE_2D,
																					 VK_IMAGE_TILING_OPTIMAL,
																					 imageUsage,
																					 0,
																					 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		if ((properties.sampleCounts & m_sampleCount) != m_sampleCount)
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		const VkImageCreateInfo					imageCreateInfo			=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
			m_imageFormat,								// VkFormat					format;
			{ m_renderSize,	m_renderSize, 1u },			// VkExtent3D				extent;
			1u,											// deUint32					mipLevels;
			1u,											// deUint32					arrayLayers;
			m_sampleCount,								// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
			imageUsage,									// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
			1u,											// deUint32					queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
		};

		m_image = vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);

		m_imageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_image), MemoryRequirement::Any);
		VK_CHECK(vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset()));
	}

	// Image View
	{
		const VkImageViewCreateInfo				imageViewCreateInfo		=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,									// const void*					pNext;
			0u,											// VkImageViewCreateFlags		flags;
			*m_image,									// VkImage						image;
			VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
			m_imageFormat,								// VkFormat						format;
			makeComponentMappingRGBA(),					// VkComponentMapping			components;
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
				0u,											// deUint32						baseMipLevel;
				1u,											// deUint32						mipLevels;
				0u,											// deUint32						baseArrayLayer;
				1u,											// deUint32						arraySize;
			},											// VkImageSubresourceRange		subresourceRange;
		};

		m_imageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
	}

	if (m_multisampling)
	{
		{
			// Resolved Image
			const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
			VkImageFormatProperties	properties;

			if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																						 m_imageFormat,
																						 VK_IMAGE_TYPE_2D,
																						 VK_IMAGE_TILING_OPTIMAL,
																						 imageUsage,
																						 0,
																						 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
			{
				TCU_THROW(NotSupportedError, "Format not supported");
			}

			const VkImageCreateInfo					imageCreateInfo			=
			{
				VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
				DE_NULL,									// const void*				pNext;
				0u,											// VkImageCreateFlags		flags;
				VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
				m_imageFormat,								// VkFormat					format;
				{ m_renderSize,	m_renderSize, 1u },			// VkExtent3D				extent;
				1u,											// deUint32					mipLevels;
				1u,											// deUint32					arrayLayers;
				VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
				VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
				imageUsage,									// VkImageUsageFlags		usage;
				VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
				1u,											// deUint32					queueFamilyIndexCount;
				&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
				VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
			};

			m_resolvedImage			= vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);
			m_resolvedImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_resolvedImage), MemoryRequirement::Any);
			VK_CHECK(vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset()));
		}

		// Resolved Image View
		{
			const VkImageViewCreateInfo				imageViewCreateInfo		=
			{
				VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
				DE_NULL,									// const void*					pNext;
				0u,											// VkImageViewCreateFlags		flags;
				*m_resolvedImage,							// VkImage						image;
				VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
				m_imageFormat,								// VkFormat						format;
				makeComponentMappingRGBA(),					// VkComponentMapping			components;
				{
					VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
					0u,											// deUint32						baseMipLevel;
					1u,											// deUint32						mipLevels;
					0u,											// deUint32						baseArrayLayer;
					1u,											// deUint32						arraySize;
				},											// VkImageSubresourceRange		subresourceRange;
			};

			m_resolvedImageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
		}

	}

	// Render Pass
	{
		const VkImageLayout						imageLayout				= VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		const VkAttachmentDescription			attachmentDesc[]		=
		{
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				m_sampleCount,										// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			},
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			}
		};

		const VkAttachmentReference				attachmentRef			=
		{
			0u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkAttachmentReference				resolveAttachmentRef	=
		{
			1u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkSubpassDescription				subpassDesc				=
		{
			0u,													// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&attachmentRef,										// const VkAttachmentReference*		pColorAttachments;
			m_multisampling ? &resolveAttachmentRef : DE_NULL,	// const VkAttachmentReference*		pResolveAttachments;
			DE_NULL,											// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pPreserveAttachments;
		};

		const VkRenderPassCreateInfo			renderPassCreateInfo	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkRenderPassCreateFlags			flags;
			m_multisampling ? 2u : 1u,							// deUint32							attachmentCount;
			attachmentDesc,										// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDesc,										// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL,											// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass =  createRenderPass(vkd, vkDevice, &renderPassCreateInfo, DE_NULL);
	}

	// FrameBuffer
	{
		const VkImageView						attachments[]			=
		{
			*m_imageView,
			*m_resolvedImageView
		};

		const VkFramebufferCreateInfo			framebufferCreateInfo	=
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkFramebufferCreateFlags	flags;
			*m_renderPass,								// VkRenderPass				renderPass;
			m_multisampling ? 2u : 1u,					// deUint32					attachmentCount;
			attachments,								// const VkImageView*		pAttachments;
			m_renderSize,								// deUint32					width;
			m_renderSize,								// deUint32					height;
			1u,											// deUint32					layers;
		};

		m_frameBuffer = createFramebuffer(vkd, vkDevice, &framebufferCreateInfo, DE_NULL);
	}

	// Uniform Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_uniformBufferSize,						// VkDeviceSize			size;
			VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_uniformBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_uniformBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_uniformBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset()));
	}

	// Descriptors
	{
		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER);
		m_descriptorPool = descriptorPoolBuilder.build(vkd, vkDevice, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

		descriptorSetLayoutBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_ALL);
		m_descriptorSetLayout = descriptorSetLayoutBuilder.build(vkd, vkDevice);

		const VkDescriptorSetAllocateInfo		descriptorSetParams		=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*m_descriptorPool,
			1u,
			&m_descriptorSetLayout.get(),
		};

		m_descriptorSet = allocateDescriptorSet(vkd, vkDevice, &descriptorSetParams);

		const VkDescriptorBufferInfo			descriptorBufferInfo	=
		{
			*m_uniformBuffer,							// VkBuffer		buffer;
			0u,											// VkDeviceSize	offset;
			VK_WHOLE_SIZE								// VkDeviceSize	range;
		};

		const VkWriteDescriptorSet				writeDescritporSet		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,		// VkStructureType					sType;
			DE_NULL,									// const void*						pNext;
			*m_descriptorSet,							// VkDescriptorSet					destSet;
			0,											// deUint32							destBinding;
			0,											// deUint32							destArrayElement;
			1u,											// deUint32							count;
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,			// VkDescriptorType					descriptorType;
			DE_NULL,									// const VkDescriptorImageInfo*		pImageInfo;
			&descriptorBufferInfo,						// const VkDescriptorBufferInfo*	pBufferInfo;
			DE_NULL										// const VkBufferView*				pTexelBufferView;
		};

		vkd.updateDescriptorSets(vkDevice, 1u, &writeDescritporSet, 0u, DE_NULL);
	}

	// Pipeline Layout
	{
		const VkPipelineLayoutCreateInfo		pipelineLayoutCreateInfo	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType				sType;
			DE_NULL,											// const void*					pNext;
			0u,													// VkPipelineLayoutCreateFlags	flags;
			1u,													// deUint32						descriptorSetCount;
			&m_descriptorSetLayout.get(),						// const VkDescriptorSetLayout*	pSetLayouts;
			0u,													// deUint32						pushConstantRangeCount;
			DE_NULL												// const VkPushConstantRange*	pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vkd, vkDevice, &pipelineLayoutCreateInfo);
	}

	// Shaders
	{
		m_vertexShaderModule	= createShaderModule(vkd, vkDevice, m_context.getBinaryCollection().get("vertext_shader"), 0);
		m_fragmentShaderModule	= createShaderModule(vkd, vkDevice, m_context.getBinaryCollection().get("fragment_shader"), 0);
	}

	// Fence
	m_fence = createFence(vkd, vkDevice);

	// Result Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_resultBufferSize,							// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_resultBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_resultBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_resultBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset()));
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Sample count = " << getSampleCountFlagsStr(m_sampleCount) << tcu::TestLog::EndMessage;
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;
}